

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_convert_int.c
# Opt level: O2

int mpt_data_convert_uint16(uint16_t *from,mpt_type_t type,void *dest)

{
  char cVar1;
  int iVar2;
  ushort **ppuVar3;
  iovec *vec;
  ushort uVar4;
  
  if (from == (uint16_t *)0x0) {
    uVar4 = 0;
  }
  else {
    uVar4 = *from;
  }
  if (type == 0x6c) {
    cVar1 = mpt_type_int(8);
    type = (mpt_type_t)cVar1;
  }
  iVar2 = -3;
  switch(type) {
  case 0x62:
    if (0x7f < uVar4) {
      return -2;
    }
    goto LAB_0010eeef;
  case 99:
    ppuVar3 = __ctype_b_loc();
    if (-1 < (short)(*ppuVar3)[uVar4]) {
      return -2;
    }
    goto LAB_0010eeef;
  case 100:
    iVar2 = 8;
    if (dest != (void *)0x0) {
      *(double *)dest = (double)uVar4;
    }
    break;
  case 0x65:
    *(longdouble *)dest = (longdouble)uVar4;
    iVar2 = 0x10;
    break;
  case 0x66:
    iVar2 = 4;
    if (dest != (void *)0x0) {
      *(float *)dest = (float)uVar4;
    }
    break;
  case 0x67:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x72:
  case 0x73:
  case 0x76:
  case 0x77:
    break;
  case 0x68:
    if ((short)uVar4 < 0) {
      return -2;
    }
  case 0x71:
    iVar2 = 2;
    if (dest != (void *)0x0) {
      *(ushort *)dest = uVar4;
    }
    break;
  case 0x69:
  case 0x75:
    iVar2 = 4;
    if (dest != (void *)0x0) {
      *(uint *)dest = (uint)uVar4;
    }
    break;
  case 0x74:
  case 0x78:
    iVar2 = 8;
    if (dest != (void *)0x0) {
      *(ulong *)dest = (ulong)uVar4;
    }
    break;
  case 0x79:
    if (0xff < uVar4) {
      return -2;
    }
LAB_0010eeef:
    iVar2 = 1;
    if (dest != (void *)0x0) {
      *(char *)dest = (char)uVar4;
    }
    break;
  default:
    if ((type == 0x51) && (iVar2 = -0x10, dest != (void *)0x0)) {
      *(uint16_t **)dest = from;
      *(undefined8 *)((long)dest + 8) = 2;
    }
  }
  return iVar2;
}

Assistant:

extern int mpt_data_convert_uint16(const uint16_t *from, MPT_TYPE(type) type, void *dest)
{
	uint16_t val = 0;
	if (from) {
		val = *from;
	}
	if (type == 'l') {
		type = mpt_type_int(sizeof(long));
	}
	switch (type) {
		case 'c':
			if (!isgraph(val)) return MPT_ERROR(BadValue);
			if (dest) *((char *) dest) = val;
			return sizeof(char);
		case 'b':
			if (val > INT8_MAX) return MPT_ERROR(BadValue);
			if (dest) *((int8_t *) dest) = val;
			return sizeof(char);
		case 'y':
			if (val > UINT8_MAX) return MPT_ERROR(BadValue);
			if (dest) *((uint8_t *) dest) = val;
			return sizeof(uint8_t);
		case 'h':
			if (val > INT16_MAX) return MPT_ERROR(BadValue);
			/* fall through */
		case 'q':
			if (dest) *((uint16_t *) dest) = val;
			return sizeof(uint16_t);
		case 'u':
		case 'i':
			if (dest) *((int32_t *) dest) = val;
			return sizeof(int32_t);
		case 't':
		case 'x':
			if (dest) *((int64_t *) dest) = val;
			return sizeof(int64_t);
		
		case 'f':
			if (dest) *((float *) dest) = val;
			return sizeof(float);
		case 'd':
			if (dest) *((double *) dest) = val;
			return sizeof(double);
#ifdef _MPT_FLOAT_EXTENDED_H
		case 'e': *((long double *) dest) = val;
			return sizeof(long double);
#endif
		case MPT_type_toVector('q'):
			if (dest) {
				struct iovec *vec = dest;
				vec->iov_base = (void *) from;
				vec->iov_len  = sizeof(*from);
			}
			return MPT_ERROR(MissingData);
		default:
			/* invalid conversion */
			return MPT_ERROR(BadType);
	}
	return sizeof(*from);
}